

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O1

int RqInterExecute(RqInterProgram *pcInterProgMem,size_t nSymSize,void *pcInSymMem,
                  size_t nInSymMemSize,void *pInterSymMem,size_t nInterSymMemSize)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  m256v IB;
  m256v Y;
  m256v local_50;
  m256v local_38;
  
  iVar2 = (pcInterProgMem->LU).n_col;
  uVar1 = (long)iVar2 * nSymSize;
  if (uVar1 < nInterSymMemSize || uVar1 - nInterSymMemSize == 0) {
    m256v_make(&local_50,iVar2,(int)nSymSize,(uint8_t *)pInterSymMem);
    m256v_make(&local_38,pcInterProgMem->nESI,(int)nSymSize,(uint8_t *)pcInSymMem);
    if (0 < (pcInterProgMem->LU).n_row) {
      lVar3 = 0;
      do {
        if (*(int *)(&pcInterProgMem->field_0x24 + lVar3 * 4) < pcInterProgMem->nESI) {
          m256v_copy_row(&local_38,*(int *)(&pcInterProgMem->field_0x24 + lVar3 * 4),&local_50,
                         (int)lVar3);
        }
        else {
          m256v_clear_row(&local_50,(int)lVar3);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (pcInterProgMem->LU).n_row);
    }
    iVar2 = 0;
    m256v_LU_invmult_inplace(&pcInterProgMem->LU,-1,(int *)0x0,(int *)0x0,&local_50);
  }
  else {
    RqInterExecute_cold_1();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int RqInterExecute(const RqInterProgram* pcInterProgMem,
		   size_t nSymSize,
		   const void* pcInSymMem,
		   size_t nInSymMemSize,
		   void* pInterSymMem,
		   size_t nInterSymMemSize)
{
	/* Check memory sizes */
#if 0
	if (symbolDataSize < pcInterProgMem->nESI * nSymSize) {
		errmsg("Too little symbol data provided.");
		return RQ_ERR_ENOMEM;
	}
#endif
	if (nInterSymMemSize < pcInterProgMem->LU.n_col * nSymSize) {
		errmsg("Not enough space for Intermediate block provided.");
		return RQ_ERR_ENOMEM;
	}

	/* Create matrices */
	m256v IB = m256v_make(pcInterProgMem->LU.n_col, nSymSize, pInterSymMem);
	m256v Y = m256v_make(pcInterProgMem->nESI, nSymSize, (void*)pcInSymMem);

	/* Move data into the IB matrix */
	for (int i = 0; i < pcInterProgMem->LU.n_row; ++i) {
		const int l = pcInterProgMem->rowperm[i];
		if (l >= pcInterProgMem->nESI) {
			/* This row contains either a padded LT symbol
			 * or an LDPC symbol or an HDPC symbol.  In
			 * any case the corresponding RHS term is zero
			 */
			m256v_clear_row(&IB, i);
		} else {
			/* Row comes from an LT symbol */
			m256v_copy_row(&Y, l, &IB, i);
		}
	}

	/* Solve */
	m256v_LU_invmult_inplace(&pcInterProgMem->LU, -1, NULL, NULL, &IB);
	return 0;
}